

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O2

void __thiscall
ClipperLib::Clipper::IntersectEdges
          (Clipper *this,TEdge *e1,TEdge *e2,IntPoint *pt,IntersectProtects protects)

{
  PolyType PVar1;
  uint uVar2;
  uint uVar3;
  PolyFillType PVar4;
  PolyFillType PVar5;
  PolyType PVar6;
  uint uVar7;
  EdgeSide EVar8;
  PolyFillType PVar9;
  PolyFillType PVar10;
  PolyFillType PVar11;
  int oldE1WindCnt;
  ulong uVar12;
  int iVar13;
  int iVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  bool bVar18;
  bool bVar19;
  
  if ((((protects & ipLeft) == ipNone) && (e1->nextInLML == (TEdge *)0x0)) && (e1->xtop == pt->X)) {
    bVar18 = e1->ytop == pt->Y;
  }
  else {
    bVar18 = false;
  }
  if ((((protects & ipRight) == ipNone) && (e2->nextInLML == (TEdge *)0x0)) && (e2->xtop == pt->X))
  {
    bVar19 = e2->ytop == pt->Y;
  }
  else {
    bVar19 = false;
  }
  PVar1 = e1->polyType;
  uVar2 = e1->outIdx;
  uVar3 = e2->outIdx;
  if (PVar1 == e2->polyType) {
    iVar14 = e1->windCnt;
    if ((&this->m_ClipFillType)[PVar1 == ptSubject] == pftEvenOdd) {
      e1->windCnt = e2->windCnt;
    }
    else {
      iVar13 = e2->windDelta + iVar14;
      iVar14 = -iVar14;
      if (iVar13 != 0) {
        iVar14 = iVar13;
      }
      e1->windCnt = iVar14;
      iVar14 = e2->windCnt - e1->windDelta;
      if (iVar14 != 0) {
        e2->windCnt = iVar14;
        goto LAB_0055d2df;
      }
      iVar14 = -e2->windCnt;
    }
    e2->windCnt = iVar14;
  }
  else {
    if ((&this->m_ClipFillType)[e2->polyType == ptSubject] == pftEvenOdd) {
      e1->windCnt2 = (uint)(e1->windCnt2 == 0);
    }
    else {
      e1->windCnt2 = e1->windCnt2 + e2->windDelta;
    }
    if ((&this->m_ClipFillType)[PVar1 == ptSubject] == pftEvenOdd) {
      e2->windCnt2 = (uint)(e2->windCnt2 == 0);
    }
    else {
      e2->windCnt2 = e2->windCnt2 - e1->windDelta;
    }
  }
LAB_0055d2df:
  PVar1 = e1->polyType;
  PVar4 = this->m_ClipFillType;
  PVar5 = this->m_SubjFillType;
  PVar9 = PVar4;
  PVar11 = PVar5;
  if (PVar1 == ptSubject) {
    PVar9 = PVar5;
    PVar11 = PVar4;
  }
  PVar6 = e2->polyType;
  PVar10 = PVar4;
  if (PVar6 == ptSubject) {
    PVar10 = PVar5;
    PVar5 = PVar4;
  }
  uVar7 = e1->windCnt;
  uVar16 = (ulong)(int)uVar7;
  if (PVar9 == pftNegative) {
    uVar16 = (ulong)(int)-uVar7;
  }
  else if (PVar9 != pftPositive) {
    if ((int)uVar7 < 1) {
      uVar7 = -uVar7;
    }
    uVar16 = (ulong)uVar7;
  }
  uVar7 = e2->windCnt;
  uVar17 = (ulong)(int)uVar7;
  if (PVar10 == pftNegative) {
    uVar17 = (ulong)(int)-uVar7;
  }
  else if (PVar10 != pftPositive) {
    if ((int)uVar7 < 1) {
      uVar7 = -uVar7;
    }
    uVar17 = (ulong)uVar7;
  }
  if (-1 < (int)(uVar2 | uVar3)) {
    if (((bVar18 == false && bVar19 == false) && (uVar16 < 2)) &&
       ((uVar17 < 2 && ((PVar1 == PVar6 || (this->m_ClipType == ctXor)))))) {
      DoBothEdges(this,e1,e2,pt);
    }
    else {
      AddLocalMaxPoly(this,e1,e2,pt);
    }
    goto switchD_0055d498_default;
  }
  if (-1 < (int)uVar2) {
    if ((uVar17 < 2) &&
       (((PVar6 == ptSubject || (this->m_ClipType != ctIntersection)) || (e2->windCnt2 != 0)))) {
      DoEdge1(this,e1,e2,pt);
    }
    goto switchD_0055d498_default;
  }
  if (-1 < (int)uVar3) {
    if ((uVar16 < 2) &&
       (((PVar1 == ptSubject || (this->m_ClipType != ctIntersection)) || (e1->windCnt2 != 0)))) {
      DoEdge2(this,e1,e2,pt);
    }
    goto switchD_0055d498_default;
  }
  if ((1 < uVar16) || ((bVar18 != false || bVar19 != false) || 1 < uVar17))
  goto switchD_0055d498_default;
  uVar2 = e1->windCnt2;
  uVar12 = (ulong)(int)uVar2;
  if (PVar11 == pftNegative) {
    uVar12 = (ulong)(int)-uVar2;
  }
  else if (PVar11 != pftPositive) {
    if ((int)uVar2 < 1) {
      uVar2 = -uVar2;
    }
    uVar12 = (ulong)uVar2;
  }
  uVar2 = e2->windCnt2;
  uVar15 = (ulong)(int)uVar2;
  if (PVar5 == pftNegative) {
    uVar15 = (ulong)(int)-uVar2;
  }
  else if (PVar5 != pftPositive) {
    if ((int)uVar2 < 1) {
      uVar2 = -uVar2;
    }
    uVar15 = (ulong)uVar2;
  }
  if (PVar1 != PVar6) goto switchD_0055d498_caseD_3;
  if ((uVar16 != 1) || (uVar17 != 1)) {
    EVar8 = e1->side;
    e1->side = e2->side;
    e2->side = EVar8;
    goto switchD_0055d498_default;
  }
  switch(this->m_ClipType) {
  case ctIntersection:
    if (((long)uVar12 < 1) || ((long)uVar15 < 1)) goto switchD_0055d498_default;
    break;
  case ctUnion:
switchD_0055d498_caseD_1:
    if ((0 < (long)uVar12) || (0 < (long)uVar15)) goto switchD_0055d498_default;
    break;
  case ctDifference:
    if (((PVar1 != ptClip) || ((long)uVar12 < 1)) || ((long)uVar15 < 1)) {
      if (PVar1 != ptSubject) goto switchD_0055d498_default;
      goto switchD_0055d498_caseD_1;
    }
    break;
  case ctXor:
    break;
  default:
    goto switchD_0055d498_default;
  }
switchD_0055d498_caseD_3:
  AddLocalMinPoly(this,e1,e2,pt);
switchD_0055d498_default:
  if ((bVar18 != bVar19) &&
     (((bVar18 != false && (-1 < e1->outIdx)) || ((bVar19 != false && (-1 < e2->outIdx)))))) {
    EVar8 = e1->side;
    e1->side = e2->side;
    e2->side = EVar8;
    iVar14 = e1->outIdx;
    e1->outIdx = e2->outIdx;
    e2->outIdx = iVar14;
  }
  if (bVar18 != false) {
    DeleteFromAEL(this,e1);
  }
  if (bVar19 != false) {
    DeleteFromAEL(this,e2);
    return;
  }
  return;
}

Assistant:

void Clipper::IntersectEdges(TEdge *e1, TEdge *e2,
     const IntPoint &pt, IntersectProtects protects)
{
  //e1 will be to the left of e2 BELOW the intersection. Therefore e1 is before
  //e2 in AEL except when e1 is being inserted at the intersection point ...
  bool e1stops = !(ipLeft & protects) &&  !e1->nextInLML &&
    e1->xtop == pt.X && e1->ytop == pt.Y;
  bool e2stops = !(ipRight & protects) &&  !e2->nextInLML &&
    e2->xtop == pt.X && e2->ytop == pt.Y;
  bool e1Contributing = ( e1->outIdx >= 0 );
  bool e2contributing = ( e2->outIdx >= 0 );

  //update winding counts...
  //assumes that e1 will be to the right of e2 ABOVE the intersection
  if ( e1->polyType == e2->polyType )
  {
    if ( IsEvenOddFillType( *e1) )
    {
      int oldE1WindCnt = e1->windCnt;
      e1->windCnt = e2->windCnt;
      e2->windCnt = oldE1WindCnt;
    } else
    {
      if (e1->windCnt + e2->windDelta == 0 ) e1->windCnt = -e1->windCnt;
      else e1->windCnt += e2->windDelta;
      if ( e2->windCnt - e1->windDelta == 0 ) e2->windCnt = -e2->windCnt;
      else e2->windCnt -= e1->windDelta;
    }
  } else
  {
    if (!IsEvenOddFillType(*e2)) e1->windCnt2 += e2->windDelta;
    else e1->windCnt2 = ( e1->windCnt2 == 0 ) ? 1 : 0;
    if (!IsEvenOddFillType(*e1)) e2->windCnt2 -= e1->windDelta;
    else e2->windCnt2 = ( e2->windCnt2 == 0 ) ? 1 : 0;
  }

  PolyFillType e1FillType, e2FillType, e1FillType2, e2FillType2;
  if (e1->polyType == ptSubject)
  {
    e1FillType = m_SubjFillType;
    e1FillType2 = m_ClipFillType;
  } else
  {
    e1FillType = m_ClipFillType;
    e1FillType2 = m_SubjFillType;
  }
  if (e2->polyType == ptSubject)
  {
    e2FillType = m_SubjFillType;
    e2FillType2 = m_ClipFillType;
  } else
  {
    e2FillType = m_ClipFillType;
    e2FillType2 = m_SubjFillType;
  }

  long64 e1Wc, e2Wc;
  switch (e1FillType)
  {
    case pftPositive: e1Wc = e1->windCnt; break;
    case pftNegative: e1Wc = -e1->windCnt; break;
    default: e1Wc = Abs(e1->windCnt);
  }
  switch(e2FillType)
  {
    case pftPositive: e2Wc = e2->windCnt; break;
    case pftNegative: e2Wc = -e2->windCnt; break;
    default: e2Wc = Abs(e2->windCnt);
  }

  if ( e1Contributing && e2contributing )
  {
    if ( e1stops || e2stops || 
      (e1Wc != 0 && e1Wc != 1) || (e2Wc != 0 && e2Wc != 1) ||
      (e1->polyType != e2->polyType && m_ClipType != ctXor) )
        AddLocalMaxPoly(e1, e2, pt); 
    else
        DoBothEdges( e1, e2, pt );
  }
  else if ( e1Contributing )
  {
    if ((e2Wc == 0 || e2Wc == 1) && 
      (m_ClipType != ctIntersection || 
      e2->polyType == ptSubject || (e2->windCnt2 != 0))) 
        DoEdge1(e1, e2, pt);
  }
  else if ( e2contributing )
  {
    if ((e1Wc == 0 || e1Wc == 1) && 
      (m_ClipType != ctIntersection || 
      e1->polyType == ptSubject || (e1->windCnt2 != 0))) 
        DoEdge2(e1, e2, pt);
  } 
  else if ( (e1Wc == 0 || e1Wc == 1) && 
    (e2Wc == 0 || e2Wc == 1) && !e1stops && !e2stops )
  {
    //neither edge is currently contributing ...

    long64 e1Wc2, e2Wc2;
    switch (e1FillType2)
    {
      case pftPositive: e1Wc2 = e1->windCnt2; break;
      case pftNegative : e1Wc2 = -e1->windCnt2; break;
      default: e1Wc2 = Abs(e1->windCnt2);
    }
    switch (e2FillType2)
    {
      case pftPositive: e2Wc2 = e2->windCnt2; break;
      case pftNegative: e2Wc2 = -e2->windCnt2; break;
      default: e2Wc2 = Abs(e2->windCnt2);
    }

    if (e1->polyType != e2->polyType)
        AddLocalMinPoly(e1, e2, pt);
    else if (e1Wc == 1 && e2Wc == 1)
      switch( m_ClipType ) {
        case ctIntersection:
          if (e1Wc2 > 0 && e2Wc2 > 0)
            AddLocalMinPoly(e1, e2, pt);
          break;
        case ctUnion:
          if ( e1Wc2 <= 0 && e2Wc2 <= 0 )
            AddLocalMinPoly(e1, e2, pt);
          break;
        case ctDifference:
          if (((e1->polyType == ptClip) && (e1Wc2 > 0) && (e2Wc2 > 0)) ||
              ((e1->polyType == ptSubject) && (e1Wc2 <= 0) && (e2Wc2 <= 0)))
                AddLocalMinPoly(e1, e2, pt);
          break;
        case ctXor:
          AddLocalMinPoly(e1, e2, pt);
      }
    else
      SwapSides( *e1, *e2 );
  }

  if(  (e1stops != e2stops) &&
    ( (e1stops && (e1->outIdx >= 0)) || (e2stops && (e2->outIdx >= 0)) ) )
  {
    SwapSides( *e1, *e2 );
    SwapPolyIndexes( *e1, *e2 );
  }

  //finally, delete any non-contributing maxima edges  ...
  if( e1stops ) DeleteFromAEL( e1 );
  if( e2stops ) DeleteFromAEL( e2 );
}